

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tandem.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
tandem::make_rank_array
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *__return_storage_ptr__,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *suffix_array,size_t extra_capacity)

{
  size_type_conflict sVar1;
  const_reference pvVar2;
  reference pvVar3;
  uint local_38;
  uint32_t i;
  allocator<unsigned_int> local_22;
  undefined1 local_21;
  size_t local_20;
  size_t extra_capacity_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *suffix_array_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *result;
  
  local_21 = 0;
  local_20 = extra_capacity;
  extra_capacity_local = (size_t)suffix_array;
  suffix_array_local = __return_storage_ptr__;
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(suffix_array);
  sVar1 = sVar1 - local_20;
  std::allocator<unsigned_int>::allocator(&local_22);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (__return_storage_ptr__,sVar1,&local_22);
  std::allocator<unsigned_int>::~allocator(&local_22);
  for (local_38 = 0;
      sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)extra_capacity_local
                        ), (ulong)local_38 < sVar1 - local_20; local_38 = local_38 + 1) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)extra_capacity_local,
                        (ulong)local_38);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (__return_storage_ptr__,(ulong)*pvVar2);
    *pvVar3 = local_38;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::uint32_t> make_rank_array(const std::vector<std::uint32_t>& suffix_array,
                                           const std::size_t extra_capacity)
{
    std::vector<std::uint32_t> result(suffix_array.size() - extra_capacity);
    for (std::uint32_t i {0}; i < (suffix_array.size() - extra_capacity); ++i) {
        result[suffix_array[i]] = i;
    }
    return result;
}